

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_c7dac::ScaleBPM_ignored_offset_Test::~ScaleBPM_ignored_offset_Test
          (ScaleBPM_ignored_offset_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ScaleBPM, ignored_offset) {
   
   Polynomial<uint32_t, double> polynomial {
      {{}, 100.0}
   };
      
   BinaryPolynomialModel<uint32_t, double> bpm(polynomial, Vartype::SPIN);
   
   bpm.Scale(0.5, {std::vector<uint32_t>{}});
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({}), 100.0);
   
   bpm.Scale(0.5, {}, true);
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({}), 100.0);
   
   bpm.Scale(0.5, {{}}, true);
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({}), 100.0);
   
   bpm.Scale(0.5);
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({}), 50.0);
   
}